

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O1

interval_t duckdb::ToQuartersOperator::Operation<long,duckdb::interval_t>(long input)

{
  bool bVar1;
  OutOfRangeException *this;
  undefined1 auVar2 [16];
  int result_1;
  interval_t result;
  int32_t local_54;
  uint local_50 [4];
  string local_40;
  
  bVar1 = TryCast::Operation<long,int>(input,&local_54,false);
  if (!bVar1) {
    auVar2 = __cxa_allocate_exception(0x10);
    CastExceptionText<long,int>(&local_40,(duckdb *)input,auVar2._8_8_);
    InvalidInputException::InvalidInputException(auVar2._0_8_,&local_40);
    __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TryMultiplyOperator::Operation<int,int,int>(local_54,3,(int32_t *)local_50);
  if (bVar1) {
    return (interval_t)ZEXT416(local_50[0]);
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Interval value %d quarters out of range","");
  OutOfRangeException::OutOfRangeException<long>(this,&local_40,input);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::MONTHS_PER_QUARTER,
		                                                               result.months)) {
			throw OutOfRangeException("Interval value %d quarters out of range", input);
		}
		result.days = 0;
		result.micros = 0;
		return result;
	}